

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_ftp.c
# Opt level: O0

int32_t ll_ftp_init(ll_ftp_t *f,ll_ftp_callbacks_t *cb)

{
  ll_ftp_callbacks_t *cb_local;
  ll_ftp_t *f_local;
  
  if ((((cb->open == (ll_ftp_open_t)0x0) || (cb->read == (ll_ftp_read_t)0x0)) ||
      (cb->write == (ll_ftp_write_t)0x0)) ||
     (((cb->close == (ll_ftp_close_t)0x0 || (cb->apply == (ll_ftp_apply_t)0x0)) ||
      ((cb->uplink == (ll_ftp_send_uplink_t)0x0 || (cb->config == (ll_ftp_dl_config_t)0x0)))))) {
    f_local._4_4_ = 2;
  }
  else {
    ll_ftp_state_set(f,IDLE);
    f->num_segs = 0;
    memset(f->rx_segs,0,0x4cc);
    f->file_id = 0;
    f->file_version = 0;
    f->file_size = 0;
    (f->time_last_msg).tv_sec = 0;
    (f->time_last_msg).tv_nsec = 0;
    f->retry_count = '\0';
    f->is_processing = false;
    memset(f->tx_buf,0,0x100);
    memcpy(&f->cb,cb,0x38);
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

int32_t ll_ftp_init(ll_ftp_t* f, ll_ftp_callbacks_t* cb)
{
    if((NULL == cb->open) || (NULL == cb->read) ||
       (NULL == cb->write) || (NULL == cb->close) ||
       (NULL == cb->apply) || (NULL == cb->uplink) ||
       (NULL == cb->config))
    {
        return LL_FTP_INVALID_VALUE;
    }

    ll_ftp_state_set(f, IDLE);
    f->num_segs = 0;
    memset(f->rx_segs, 0, sizeof(f->rx_segs[0]) * NUM_RX_SEGS_BITMASK);
    f->file_id = 0;
    f->file_version = 0;
    f->file_size = 0;
    f->time_last_msg.tv_sec = 0;
    f->time_last_msg.tv_nsec = 0;
    f->retry_count = 0;
    f->is_processing = false;
    memset(f->tx_buf, 0, sizeof(f->tx_buf[0]) * LL_FTP_TX_BUF_SIZE);

    f->cb = *cb;

    return LL_FTP_OK;
}